

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O0

LogHelper * util::operator<<(LogHelper *h,Encoding *t)

{
  Encoding *t_local;
  LogHelper *h_local;
  
  if ((h->clearline & 1U) != 0) {
    h->clearline = false;
    operator<<(h,clearline);
  }
  ::operator<<(h->screen,*t);
  if ((h->file != (ostream *)0x0) && ((h->statusmsg & 1U) == 0)) {
    ::operator<<(h->file,*t);
  }
  return h;
}

Assistant:

LogHelper& operator<<(LogHelper& h, const T& t)
{
    if (h.clearline)
    {
        h.clearline = false;
        h << ttycmd::clearline;
    }

    *h.screen << t;
    if (h.file && !h.statusmsg) *h.file << t;
    return h;
}